

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_lore_mimic(parser *p)

{
  wchar_t tval;
  wchar_t sval;
  void *pvVar1;
  char *pcVar2;
  object_kind *poVar3;
  undefined8 *puVar4;
  parser_error pVar5;
  
  pvVar1 = parser_priv(p);
  pVar5 = PARSE_ERROR_NONE;
  if (pvVar1 != (void *)0x0) {
    pcVar2 = parser_getsym(p,"tval");
    tval = tval_find_idx(pcVar2);
    if (tval < L'\0') {
      pVar5 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      pcVar2 = parser_getsym(p,"sval");
      sval = lookup_sval(tval,pcVar2);
      if (sval < L'\0') {
        pVar5 = PARSE_ERROR_UNRECOGNISED_SVAL;
      }
      else {
        poVar3 = lookup_kind(tval,sval);
        if (poVar3 == (object_kind *)0x0) {
          pVar5 = PARSE_ERROR_NO_KIND_FOUND;
        }
        else {
          puVar4 = (undefined8 *)mem_zalloc(0x10);
          puVar4[1] = poVar3;
          *puVar4 = *(undefined8 *)((long)pvVar1 + 0x58);
          *(undefined8 **)((long)pvVar1 + 0x58) = puVar4;
          pVar5 = PARSE_ERROR_NONE;
        }
      }
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_lore_mimic(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct monster_mimic *m;
	int tval, sval;
	struct object_kind *kind;

	if (!l)
		return PARSE_ERROR_NONE;
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	sval = lookup_sval(tval, parser_getsym(p, "sval"));
	if (sval < 0)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	kind = lookup_kind(tval, sval);
	if (!kind)
		return PARSE_ERROR_NO_KIND_FOUND;
	m = mem_zalloc(sizeof *m);
	m->kind = kind;
	m->next = l->mimic_kinds;
	l->mimic_kinds = m;
	return PARSE_ERROR_NONE;
}